

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldatabase.cpp
# Opt level: O2

QSqlDatabase __thiscall
QSqlDatabase::cloneDatabase(QSqlDatabase *this,QSqlDatabase *other,QString *connectionName)

{
  bool bVar1;
  EVP_PKEY_CTX *src;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isValid(other);
  if (bVar1) {
    this->d = (QSqlDatabasePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    driverName((QString *)&local_40,other);
    QSqlDatabase(this,(QString *)&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    QSqlDatabasePrivate::copy(this->d,(EVP_PKEY_CTX *)other->d,src);
    QSqlDatabasePrivate::addDatabase(this,connectionName);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return (QSqlDatabase)(QSqlDatabasePrivate *)this;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QSqlDatabase(this);
    return (QSqlDatabase)(QSqlDatabasePrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QSqlDatabase QSqlDatabase::cloneDatabase(const QSqlDatabase &other, const QString &connectionName)
{
    if (!other.isValid())
        return QSqlDatabase();

    QSqlDatabase db(other.driverName());
    db.d->copy(other.d);
    QSqlDatabasePrivate::addDatabase(db, connectionName);
    return db;
}